

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkResizeVecArray(ARKVecResizeFn resize,void *resize_data,int count,N_Vector tmpl,N_Vector **v,
                     sunindextype lrw_diff,long *lrw,sunindextype liw_diff,long *liw)

{
  int iVar1;
  N_Vector *pp_Var2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = 1;
  if (*v != (N_Vector *)0x0) {
    if (resize == (ARKVecResizeFn)0x0) {
      N_VDestroyVectorArray(*v,count);
      *v = (N_Vector *)0x0;
      pp_Var2 = (N_Vector *)N_VCloneVectorArray(count,tmpl);
      *v = pp_Var2;
      if (pp_Var2 != (N_Vector *)0x0) {
LAB_0014ce9a:
        *lrw = *lrw + lrw_diff * count;
        *liw = *liw + liw_diff * count;
        return 1;
      }
    }
    else {
      uVar3 = 0;
      uVar4 = 0;
      if (0 < count) {
        uVar4 = (ulong)(uint)count;
      }
      do {
        if (uVar4 == uVar3) goto LAB_0014ce9a;
        iVar1 = (*resize)((*v)[uVar3],tmpl,resize_data);
        uVar3 = uVar3 + 1;
      } while (iVar1 == 0);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

sunbooleantype arkResizeVecArray(ARKVecResizeFn resize, void* resize_data,
                                 int count, N_Vector tmpl, N_Vector** v,
                                 sunindextype lrw_diff, long int* lrw,
                                 sunindextype liw_diff, long int* liw)
{
  int i;

  if (*v != NULL)
  {
    if (resize == NULL)
    {
      N_VDestroyVectorArray(*v, count);
      *v = NULL;
      *v = N_VCloneVectorArray(count, tmpl);
      if (*v == NULL) { return (SUNFALSE); }
    }
    else
    {
      for (i = 0; i < count; i++)
      {
        if (resize((*v)[i], tmpl, resize_data)) { return (SUNFALSE); }
      }
    }
    *lrw += count * lrw_diff;
    *liw += count * liw_diff;
  }
  return (SUNTRUE);
}